

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  EVP_PKEY_CTX *ctx;
  int option_index;
  char output_filename [8192];
  undefined4 local_4044;
  char *local_4040;
  char local_4038 [8192];
  char local_2038 [8200];
  
  local_4044 = 0;
  if (1 < argc) {
    local_4040 = (char *)0x0;
    while( true ) {
      ctx = (EVP_PKEY_CTX *)(ulong)(uint)argc;
      iVar2 = getopt_long(ctx,argv,":vho:",long_options,&local_4044);
      if (iVar2 != 0x6f) break;
      local_4040 = strdup(_optarg);
    }
    if (iVar2 < 0x3a) {
      if (iVar2 == -1) {
        if (1 < argc - _optind) {
          ctx = (EVP_PKEY_CTX *)argv;
          main_cold_2();
        }
        init(ctx);
        __s = argv[_optind];
        finname = __s;
        modprefix = strdup(__s);
        pcVar5 = strrchr(modprefix,0x2e);
        strcpy(local_4038,__s);
        if (pcVar5 != (char *)0x0) {
          *pcVar5 = '\0';
        }
        pcVar8 = "r";
        fin = (FILE *)fopen(local_4038,"r");
        pcVar5 = local_4040;
        if ((FILE *)fin == (FILE *)0x0) {
          sprintf(local_4038,"%s.mod",__s);
          sprintf(finname,"%s.mod",__s);
          pcVar8 = "r";
          fin = (FILE *)fopen(local_4038,"r");
          if ((FILE *)fin == (FILE *)0x0) {
            diag("Can\'t open input file: ",local_4038);
          }
        }
        if (pcVar5 == (char *)0x0) {
          sprintf(local_2038,"%s.cpp",modprefix);
LAB_0011067a:
          main_cold_5();
          return 0;
        }
        iVar2 = mkdir_p(pcVar5);
        if (iVar2 == 0) {
          main_cold_4();
          goto LAB_0011067a;
        }
        main_cold_3();
        iVar2 = (int)pcVar5;
        lVar1 = *(long *)(pcVar8 + 8);
        uVar3 = *(uint *)(lVar1 + 0x34);
        if (iVar2 == 0) {
          if ((uVar3 & 1) != 0) {
            diag("Multiple declaration of ",*(char **)(lVar1 + 0x48));
          }
          uVar3 = uVar3 | 1;
        }
        *(uint *)(lVar1 + 0x34) = uVar3 | 8;
        iVar7 = (int)*(short *)(lVar1 + 0x44);
        if (previous_str == (char *)0x0 && iVar7 <= iVar2) {
          __assert_fail("previous_str",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/parsact.c"
                        ,0x77,"void explicit_decl(int, Item *)");
        }
        iVar4 = (int)lVar1 + 8;
        uVar3 = (uint)*(undefined8 *)(lVar1 + 8);
        if ((~uVar3 & 0x12) == 0) {
          explicit_decl_cold_3();
          uVar6 = extraout_RAX;
        }
        else if ((~uVar3 & 0x18) == 0) {
          explicit_decl_cold_2();
          uVar6 = extraout_RAX_00;
        }
        else {
          if ((~uVar3 & 10) != 0) {
            if (iVar7 <= iVar2) {
              if (iVar7 < iVar2) {
                *(char **)(lVar1 + 0x28) = previous_str;
                return iVar4;
              }
              iVar2 = strcmp(*(char **)(lVar1 + 0x28),previous_str);
              if (iVar2 == 0) {
                return 0;
              }
              diag(*(char **)(lVar1 + 0x48)," has different values at same level");
            }
            goto LAB_00110777;
          }
          explicit_decl_cold_1();
          uVar6 = extraout_RAX_01;
        }
        if ((uVar6 & 1) == 0) {
          *(char **)(lVar1 + 0x28) = previous_str;
        }
        iVar4 = (int)*(short *)(lVar1 + 0x44);
        if (iVar4 <= iVar2) {
          return iVar4;
        }
LAB_00110777:
        *(short *)(lVar1 + 0x44) = (short)pcVar5;
        return iVar4;
      }
    }
    else if (iVar2 == 0x3a) {
      main_cold_1();
    }
    else {
      if (iVar2 == 0x68) {
        show_options(argv);
LAB_001106cd:
        exit(0);
      }
      if (iVar2 == 0x76) {
        puts(nmodl_version_);
        goto LAB_001106cd;
      }
    }
    main_cold_6();
  }
  show_options(argv);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  int option        = -1;
  int option_index  = 0;
  char* output_dir = NULL;

  if (argc < 2) {
    show_options(argv);
    exit(1);
  }

  while ( (option = getopt_long (argc, argv, ":vho:", long_options, &option_index)) != -1) {
    switch (option) {
      case 'v':
        printf("%s\n", nmodl_version_);
        exit(0);

      case 'o':
        output_dir = strdup(optarg);
        break;

      case 'h':
        show_options(argv);
        exit(0);

      case ':':
        fprintf(stderr, "%s: option '-%c' requires an argument\n", argv[0], optopt);
        exit (-1);

      case '?':
      default:
        fprintf(stderr, "%s: invalid option `-%c' \n", argv[0], optopt);
        exit (-1);
    }
  }
  if ((argc - optind) > 1) {
    fprintf(stderr, "%s: Warning several input files specified on command line but only one will be processed\n", argv[0]);
  }

  init(); /* keywords into symbol table, initialize lists, etc. */
  finname = argv[optind];
  openfiles(finname, output_dir); /* .mrg else .mod,  .var, .c */
  IGNORE(yyparse());
/*
 * At this point all blocks are fully processed except the kinetic
 * block and the solve statements. Even in these cases the 
 * processing doesn't involve syntax since the information is
 * held in intermediate lists of specific structure.
 *
 */
/*
 * go through the list of solve statements and construct the model()
 * code 
 */
  solvhandler();
/* 
 * NAME's can be used in many cases before they were declared and
 * no checking up to this point has been done to make sure that
 * names have been used in only one way.
 *
 */
  consistency();
  chk_thread_safe();
  parout();
  c_out();   /* print .c file */

  IGNORE(fclose(fcout));

  free_global_variables();

#if NMODL && VECTORIZE
  if (vectorize) {
    Fprintf(stderr, "Thread Safe\n");
  }
  if (usederivstatearray) {
    fprintf(stderr, "Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n");
    fprintf(stderr, " %s.c file may be manually edited to fix these errors.\n", modprefix);
  }
#endif

#if LINT
{ /* for lex */
  extern int      yytchar, yylineno;
  extern FILE    *yyin;
  IGNORE(yyin);
  IGNORE(yytchar);
  IGNORE(yylineno);
  IGNORE(yyinput());
  yyunput(ilint);
  yyoutput(ilint);
}
#endif
  return 0;
}